

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# type-updating.h
# Opt level: O2

void __thiscall wasm::TypeUpdater::visitExpression(TypeUpdater *this,Expression *curr)

{
  pointer ppEVar1;
  Block *pBVar2;
  Expression **ppEVar3;
  mapped_type *ppEVar4;
  mapped_type *pmVar5;
  ulong uVar6;
  mapped_type pEVar7;
  Block *local_28;
  Expression *curr_local;
  
  ppEVar1 = (this->
            super_ExpressionStackWalker<wasm::TypeUpdater,_wasm::UnifiedExpressionVisitor<wasm::TypeUpdater,_void>_>
            ).expressionStack.flexible.
            super__Vector_base<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>._M_impl.
            super__Vector_impl_data._M_start;
  uVar6 = ((long)(this->
                 super_ExpressionStackWalker<wasm::TypeUpdater,_wasm::UnifiedExpressionVisitor<wasm::TypeUpdater,_void>_>
                 ).expressionStack.flexible.
                 super__Vector_base<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>._M_impl
                 .super__Vector_impl_data._M_finish - (long)ppEVar1 >> 3) +
          (this->
          super_ExpressionStackWalker<wasm::TypeUpdater,_wasm::UnifiedExpressionVisitor<wasm::TypeUpdater,_void>_>
          ).expressionStack.usedFixed;
  if (uVar6 < 2) {
    pEVar7 = (mapped_type)0x0;
  }
  else {
    ppEVar3 = ppEVar1 + (uVar6 - 0xc);
    if (uVar6 - 2 < 10) {
      ppEVar3 = (this->
                super_ExpressionStackWalker<wasm::TypeUpdater,_wasm::UnifiedExpressionVisitor<wasm::TypeUpdater,_void>_>
                ).expressionStack.fixed._M_elems + (uVar6 - 2);
    }
    pEVar7 = *ppEVar3;
  }
  local_28 = (Block *)curr;
  ppEVar4 = std::
            map<wasm::Expression_*,_wasm::Expression_*,_std::less<wasm::Expression_*>,_std::allocator<std::pair<wasm::Expression_*const,_wasm::Expression_*>_>_>
            ::operator[](&this->parents,(key_type *)&local_28);
  pBVar2 = local_28;
  *ppEVar4 = pEVar7;
  if ((local_28->super_SpecificExpression<(wasm::Expression::Id)1>).super_Expression._id == BlockId)
  {
    if ((local_28->name).super_IString.str._M_str != (char *)0x0) {
      pmVar5 = std::
               map<wasm::Name,_wasm::TypeUpdater::BlockInfo,_std::less<wasm::Name>,_std::allocator<std::pair<const_wasm::Name,_wasm::TypeUpdater::BlockInfo>_>_>
               ::operator[](&this->blockInfos,&local_28->name);
      pmVar5->block = pBVar2;
    }
  }
  else {
    BranchUtils::
    operateOnScopeNameUses<wasm::TypeUpdater::visitExpression(wasm::Expression*)::_lambda(wasm::Name&)_1_>
              ((Expression *)local_28,(anon_class_8_1_8991fb9c)this);
  }
  discoverBreaks(this,(Expression *)local_28,1);
  return;
}

Assistant:

void visitExpression(Expression* curr) {
    if (expressionStack.size() > 1) {
      parents[curr] = expressionStack[expressionStack.size() - 2];
    } else {
      parents[curr] = nullptr; // this is the top level
    }
    // discover block/break relationships
    if (auto* block = curr->dynCast<Block>()) {
      if (block->name.is()) {
        blockInfos[block->name].block = block;
      }
    } else {
      BranchUtils::operateOnScopeNameUses(curr, [&](Name& name) {
        // ensure info exists, discoverBreaks can then fill it
        blockInfos[name];
      });
    }
    // add a break to the info, for break and switch
    discoverBreaks(curr, +1);
  }